

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O2

int Bdc_ManNodeVerify(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Fun_t *pFunc)

{
  uint *pOut;
  int iVar1;
  
  pOut = p->puTemp1;
  if (((ulong)pFunc & 1) == 0) {
    Kit_TruthCopy(pOut,pFunc->puFunc,p->nVars);
  }
  else {
    Kit_TruthNot(pOut,*(uint **)(((ulong)pFunc & 0xfffffffffffffffe) + 0x20),p->nVars);
  }
  iVar1 = Bdc_TableCheckContainment(p,pIsf,pOut);
  return iVar1;
}

Assistant:

int Bdc_ManNodeVerify( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Fun_t * pFunc )
{
    unsigned * puTruth = p->puTemp1;
    if ( Bdc_IsComplement(pFunc) )
        Kit_TruthNot( puTruth, Bdc_Regular(pFunc)->puFunc, p->nVars );
    else
        Kit_TruthCopy( puTruth, pFunc->puFunc, p->nVars );
    return Bdc_TableCheckContainment( p, pIsf, puTruth );
}